

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_flat_file.c
# Opt level: O0

void ftest_insert(planck_unit_test_t *tc,ion_flat_file_t *flat_file,ion_key_t key,ion_value_t value,
                 ion_err_t expected_status,ion_result_count_t expected_count,
                 ion_boolean_t check_result)

{
  FILE *pFVar1;
  long lVar2;
  planck_unit_test_t *ppVar3;
  void *pvVar4;
  void *__s1;
  ion_value_t location;
  planck_unit_result_t pVar5;
  int iVar6;
  ion_status_t iVar7;
  size_t sVar8;
  ulong uVar9;
  void *pvVar10;
  undefined8 uStack_a0;
  undefined8 local_98;
  planck_unit_test_t *local_90;
  void *local_88;
  void *local_80;
  ion_err_t local_71;
  undefined1 local_70 [7];
  ion_err_t err;
  ion_flat_file_row_t test_row;
  ion_fpos_t cur_index;
  unsigned_long __vla_expr1;
  unsigned_long __vla_expr0;
  char local_38;
  int32_t iStack_34;
  ion_status_t status;
  ion_result_count_t expected_count_local;
  ion_err_t expected_status_local;
  ion_value_t value_local;
  ion_key_t key_local;
  ion_flat_file_t *flat_file_local;
  planck_unit_test_t *tc_local;
  
  uStack_a0 = 0x10157a;
  iVar7 = flat_file_insert(flat_file,key,value);
  local_38 = iVar7.error;
  uStack_a0 = 0x10159b;
  pVar5 = planck_unit_assert_int_are_equal
                    (tc,(int)expected_status,(int)local_38,0x83,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/flat_file/test_flat_file.c"
                    );
  if (pVar5 == '\0') {
    uStack_a0 = 0x1015b5;
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  iStack_34 = iVar7.count;
  uStack_a0 = 0x1015d0;
  pVar5 = planck_unit_assert_int_are_equal
                    (tc,expected_count,iStack_34,0x84,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/flat_file/test_flat_file.c"
                    );
  if (pVar5 == '\0') {
    uStack_a0 = 0x1015ea;
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  if (check_result != '\0') {
    uVar9 = flat_file->row_size + 0xf & 0xfffffffffffffff0;
    lVar2 = -uVar9;
    local_88 = (void *)((long)&local_98 + lVar2);
    *(undefined1 *)((long)&local_98 - uVar9) = 1;
    iVar6 = (flat_file->super).record.key_size;
    *(undefined8 *)((long)&uStack_a0 + lVar2) = 0x10163d;
    memcpy((void *)((long)&local_98 + lVar2 + 1),key,(long)iVar6);
    pvVar10 = (void *)((long)(flat_file->super).record.key_size + 1 + (long)local_88);
    iVar6 = (flat_file->super).record.value_size;
    *(undefined8 *)((long)&uStack_a0 + lVar2) = 0x10165b;
    memcpy(pvVar10,value,(long)iVar6);
    pvVar10 = (void *)(((long)&local_98 + lVar2) - (flat_file->row_size + 0xf & 0xfffffffffffffff0))
    ;
    pFVar1 = (FILE *)flat_file->data_file;
    lVar2 = flat_file->start_of_data;
    local_80 = pvVar10;
    *(undefined8 *)((long)pvVar10 + -8) = 0x101696;
    fseek(pFVar1,lVar2,0);
    test_row.value = (ion_value_t)0x0;
    while( true ) {
      pvVar4 = local_80;
      sVar8 = flat_file->row_size;
      pFVar1 = (FILE *)flat_file->data_file;
      *(undefined8 *)((long)pvVar10 + -8) = 0x1016be;
      sVar8 = fread(pvVar4,sVar8,1,pFVar1);
      __s1 = local_80;
      pvVar4 = local_88;
      if (sVar8 != 1) break;
      sVar8 = flat_file->row_size;
      *(undefined8 *)((long)pvVar10 + -8) = 0x1016e5;
      iVar6 = memcmp(__s1,pvVar4,sVar8);
      location = test_row.value;
      if (iVar6 == 0) {
        *(undefined8 *)((long)pvVar10 + -8) = 0x101702;
        local_71 = flat_file_read_row(flat_file,(ion_fpos_t)location,(ion_flat_file_row_t *)local_70
                                     );
        iVar6 = (int)local_71;
        *(undefined8 *)((long)pvVar10 + -8) = 0x101720;
        pVar5 = planck_unit_assert_int_are_equal
                          (tc,0,iVar6,0x9c,
                           "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/flat_file/test_flat_file.c"
                          );
        if (pVar5 == '\0') {
          *(undefined8 *)((long)pvVar10 + -8) = 0x10173a;
          longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
        }
        *(undefined8 *)((long)pvVar10 + -8) = 0x101758;
        pVar5 = planck_unit_assert_int_are_equal
                          (tc,1,(uint)local_70[0],0x9d,
                           "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/flat_file/test_flat_file.c"
                          );
        if (pVar5 == '\0') {
          *(undefined8 *)((long)pvVar10 + -8) = 0x101772;
          longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
        }
        iVar6 = (flat_file->super).record.key_size;
        local_90 = tc;
        *(undefined8 *)((long)pvVar10 + -8) = 0x101792;
        iVar6 = memcmp((void *)test_row._0_8_,key,(long)iVar6);
        ppVar3 = local_90;
        *(undefined8 *)((long)pvVar10 + -8) = 0x1017ae;
        pVar5 = planck_unit_assert_int_are_equal
                          (ppVar3,0,iVar6,0x9e,
                           "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/flat_file/test_flat_file.c"
                          );
        if (pVar5 == '\0') {
          *(undefined8 *)((long)pvVar10 + -8) = 0x1017c8;
          longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
        }
        iVar6 = (flat_file->super).record.value_size;
        local_98 = tc;
        *(undefined8 *)((long)pvVar10 + -8) = 0x1017e8;
        iVar6 = memcmp(test_row.key,value,(long)iVar6);
        ppVar3 = local_98;
        *(undefined8 *)((long)pvVar10 + -8) = 0x101804;
        pVar5 = planck_unit_assert_int_are_equal
                          (ppVar3,0,iVar6,0x9f,
                           "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/flat_file/test_flat_file.c"
                          );
        if (pVar5 != '\0') {
          return;
        }
        *(undefined8 *)((long)pvVar10 + -8) = 0x10181e;
        longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
      }
      test_row.value = (ion_value_t)((long)test_row.value + 1);
    }
    *(undefined8 *)((long)pvVar10 + -8) = 0x101856;
    pVar5 = planck_unit_assert_true
                      (tc,0,0xa7,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/flat_file/test_flat_file.c"
                       ,"asserted to fail");
    if (pVar5 == '\0') {
      *(undefined8 *)((long)pvVar10 + -8) = 0x101870;
      longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
    }
  }
  return;
}

Assistant:

void
ftest_insert(
	planck_unit_test_t	*tc,
	ion_flat_file_t		*flat_file,
	ion_key_t			key,
	ion_value_t			value,
	ion_err_t			expected_status,
	ion_result_count_t	expected_count,
	ion_boolean_t		check_result
) {
	ion_status_t status = flat_file_insert(flat_file, key, value);

	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, expected_status, status.error);
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, expected_count, status.count);

	if (check_result) {
		ion_byte_t expected_result[flat_file->row_size];

		memset(expected_result, ION_FLAT_FILE_STATUS_OCCUPIED, sizeof(ion_flat_file_row_status_t));
		memcpy(expected_result + sizeof(ion_flat_file_row_status_t), key, flat_file->super.record.key_size);
		memcpy(expected_result + sizeof(ion_flat_file_row_status_t) + flat_file->super.record.key_size, value, flat_file->super.record.value_size);

		ion_byte_t read_buffer[flat_file->row_size];

		fseek(flat_file->data_file, flat_file->start_of_data, SEEK_SET);

		ion_fpos_t cur_index = 0;

		while (boolean_true) {
			if (1 != fread(read_buffer, flat_file->row_size, 1, flat_file->data_file)) {
				break;
			}

			if (0 == memcmp(read_buffer, expected_result, flat_file->row_size)) {
				ion_flat_file_row_t test_row;
				ion_err_t			err = flat_file_read_row(flat_file, cur_index, &test_row);

				PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, err_ok, err);
				PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, ION_FLAT_FILE_STATUS_OCCUPIED, test_row.row_status);
				PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, 0, memcmp(test_row.key, key, flat_file->super.record.key_size));
				PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, 0, memcmp(test_row.value, value, flat_file->super.record.value_size));
				return;
			}

			cur_index++;
		}

		/* If we reach here that means that the record we were looking for wasn't found :( */
		PLANCK_UNIT_SET_FAIL(tc);
	}
}